

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_result_double(unqlite_context *pCtx,double Value)

{
  jx9_value *pObj;
  
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = Value;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 4;
  jx9MemObjTryInteger(pObj);
  return 0;
}

Assistant:

int unqlite_result_double(unqlite_context *pCtx, double Value)
{
	return jx9_result_double(pCtx,Value);
}